

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

bool __thiscall
cmFindBase::ParseArguments
          (cmFindBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmFindCommon *this_00;
  string *psVar1;
  cmMakefile *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  bool bVar3;
  bool bVar4;
  optional<cmWindowsRegistry::View> oVar5;
  cmState *this_03;
  string *psVar6;
  long lVar7;
  char *extraout_RDX;
  uint uVar8;
  uint uVar9;
  undefined4 uVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  pointer pbVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  cmFindBase *this_04;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  string_view name;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view separator;
  Command command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long local_a0;
  cmFindBase *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  long local_78;
  string *local_70;
  cmList macros;
  string local_50;
  
  uVar12 = (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar12 < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&command,"called with incorrect number of arguments",
               (allocator<char> *)&local_c0);
    cmFindCommon::SetError(&this->super_cmFindCommon,(string *)&command);
    std::__cxx11::string::~string((string *)&command);
    bVar4 = false;
  }
  else {
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar1 = &this->VariableDocumentation;
    bVar4 = false;
    uVar14 = 0;
    local_98 = this;
    while (this_04 = local_98, uVar9 = (uint)uVar14, uVar14 < uVar12) {
      pbVar11 = (argsIn->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (bVar4) {
LAB_00491100:
        bVar3 = std::operator==(pbVar11 + uVar14,"NO_CACHE");
        if (bVar3) {
          local_98->StoreResultInCache = false;
        }
        else {
          bVar3 = std::operator==((argsIn->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar14,"ENV");
          if (bVar3) {
            uVar8 = uVar9 + 1;
            if (uVar8 < uVar12) {
              cmsys::SystemTools::GetPath
                        (&args,(argsIn->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
              uVar9 = uVar8;
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&args,(argsIn->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar14);
          }
        }
      }
      else {
        bVar3 = std::operator!=(pbVar11 + uVar14,"DOC");
        if (bVar3) {
          pbVar11 = (argsIn->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00491100;
        }
        if (uVar9 + 1 < uVar12) {
          bVar4 = true;
          std::__cxx11::string::_M_assign((string *)psVar1);
          uVar9 = uVar9 + 1;
        }
        else {
          bVar4 = false;
        }
      }
      uVar14 = (ulong)(uVar9 + 1);
    }
    if ((ulong)((long)args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&command,"called with incorrect number of arguments",
                 (allocator<char> *)&local_c0);
      cmFindCommon::SetError(&local_98->super_cmFindCommon,(string *)&command);
LAB_004911e2:
      std::__cxx11::string::~string((string *)&command);
LAB_004911ec:
      bVar4 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_98->VariableName);
      bVar4 = CheckForVariableDefined(this_04);
      if (bVar4) {
        this_04->AlreadyDefined = true;
        bVar4 = true;
      }
      else {
        this_00 = &this_04->super_cmFindCommon;
        cmFindCommon::SelectDefaultSearchModes(this_00);
        cmFindCommon::SelectDefaultRootPathMode(this_00);
        cmFindCommon::SelectDefaultMacMode(this_00);
        local_88 = &(this_04->super_cmFindCommon).UserGuessArgs;
        local_80 = &this_04->Names;
        local_70 = (string *)&this_04->ValidatorName;
        bVar4 = false;
        uVar10 = 1;
        uVar12 = 1;
        while (uVar9 = (uint)uVar12,
              uVar12 < (ulong)((long)args.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)args.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          bVar3 = std::operator==(args.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar12,"NAMES");
          if (bVar3) {
            uVar10 = 1;
LAB_00491304:
            bVar4 = true;
          }
          else {
            bVar3 = std::operator==(args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar12,"PATHS");
            if (bVar3) {
              uVar10 = 2;
              goto LAB_00491304;
            }
            bVar3 = std::operator==(args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar12,"HINTS");
            if (bVar3) {
              uVar10 = 4;
              goto LAB_00491304;
            }
            bVar3 = std::operator==(args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                    "PATH_SUFFIXES");
            if (bVar3) {
              uVar10 = 3;
              goto LAB_00491304;
            }
            bVar3 = std::operator==(args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                    "NAMES_PER_DIR");
            if (bVar3) {
              if (this_04->NamesPerDirAllowed != true) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&command,"does not support NAMES_PER_DIR",
                           (allocator<char> *)&local_c0);
                cmFindCommon::SetError(this_00,(string *)&command);
                goto LAB_004911e2;
              }
              this_04->NamesPerDir = true;
LAB_0049135b:
              uVar10 = 0;
            }
            else {
              bVar3 = std::operator==(args.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                      "NO_SYSTEM_PATH");
              if (bVar3) {
                (this_04->super_cmFindCommon).NoDefaultPath = true;
                goto LAB_0049135b;
              }
              bVar3 = std::operator==(args.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar12,"REQUIRED")
              ;
              if (bVar3) {
                this_04->Required = true;
                uVar10 = 0;
                goto LAB_00491304;
              }
              bVar3 = std::operator==(args.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                      "REGISTRY_VIEW");
              if (bVar3) {
                uVar9 = uVar9 + 1;
                uVar12 = (ulong)uVar9;
                if ((long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar12) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&command,"missing required argument for \"REGISTRY_VIEW\"",
                             (allocator<char> *)&local_c0);
                  cmFindCommon::SetError(this_00,(string *)&command);
                  goto LAB_004911e2;
                }
                name._M_str = extraout_RDX;
                name._M_len = (size_t)args.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus.
                                      _M_p;
                oVar5 = cmWindowsRegistry::ToView
                                  ((cmWindowsRegistry *)
                                   args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                   _M_string_length,name);
                if (((ulong)oVar5.super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                            _M_payload.super__Optional_payload_base<cmWindowsRegistry::View> >> 0x20
                    & 1) == 0) {
                  cmStrCat<char_const(&)[42],std::__cxx11::string&>
                            ((string *)&command,
                             (char (*) [42])"given invalid value for \"REGISTRY_VIEW\": ",
                             args.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar12);
                  cmFindCommon::SetError(this_00,(string *)&command);
                  goto LAB_004911e2;
                }
                (this_04->super_cmFindCommon).RegistryView =
                     oVar5.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
                     super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
              }
              else {
                bVar3 = std::operator==(args.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                        "VALIDATOR");
                if (bVar3) {
                  uVar9 = uVar9 + 1;
                  uVar12 = (ulong)uVar9;
                  if ((long)args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar12) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&command,"missing required argument for \"VALIDATOR\"",
                               (allocator<char> *)&local_c0);
                    cmFindCommon::SetError(this_00,(string *)&command);
                    goto LAB_004911e2;
                  }
                  this_03 = cmMakefile::GetState((this_04->super_cmFindCommon).Makefile);
                  local_a0 = uVar12 * 0x20;
                  cmState::GetCommand(&command,this_03,
                                      args.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar12);
                  if (command.super__Function_base._M_manager == (_Manager_type)0x0) {
                    local_50._M_dataplus._M_p._0_1_ = 0x2e;
                    cmStrCat<char_const(&)[49],std::__cxx11::string&,char>
                              (&local_c0,
                               (char (*) [49])"command specified for \"VALIDATOR\" is undefined: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((args.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + local_a0),(char *)&local_50);
                    cmFindCommon::SetError(this_00,&local_c0);
                    std::__cxx11::string::~string((string *)&local_c0);
                    std::_Function_base::~_Function_base(&command.super__Function_base);
                    goto LAB_004911ec;
                  }
                  pbVar11 = (pointer)((long)&((args.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + local_a0);
                  this_01 = (this_04->super_cmFindCommon).Makefile;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_50,"MACROS",&local_c1);
                  psVar6 = (string *)cmMakefile::GetProperty(this_01,&local_50);
                  if (psVar6 == (string *)0x0) {
                    psVar6 = &cmValue::Empty_abi_cxx11_;
                  }
                  std::__cxx11::string::string((string *)&local_c0,(string *)psVar6);
                  init._M_len = 1;
                  init._M_array = &local_c0;
                  cmList::cmList(&macros,init);
                  std::__cxx11::string::~string((string *)&local_c0);
                  std::__cxx11::string::~string((string *)&local_50);
                  local_90 = macros.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  lVar13 = (long)macros.Values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)macros.Values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar7 = lVar13 >> 7;
                  __it._M_current =
                       macros.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_c0._M_dataplus._M_p = (pointer)pbVar11;
                  while (0 < lVar7) {
                    local_78 = lVar7;
                    bVar3 = __gnu_cxx::__ops::
                            _Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                            ::operator()((_Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                          *)&local_c0,__it);
                    _Var15._M_current = __it._M_current;
                    if (bVar3) goto LAB_004916ae;
                    bVar3 = __gnu_cxx::__ops::
                            _Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                            ::operator()((_Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                          *)&local_c0,__it._M_current + 1);
                    _Var15._M_current = __it._M_current + 1;
                    if (bVar3) goto LAB_004916ae;
                    bVar3 = __gnu_cxx::__ops::
                            _Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                            ::operator()((_Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                          *)&local_c0,__it._M_current + 2);
                    _Var15._M_current = __it._M_current + 2;
                    if (bVar3) goto LAB_004916ae;
                    bVar3 = __gnu_cxx::__ops::
                            _Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                            ::operator()((_Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                          *)&local_c0,__it._M_current + 3);
                    _Var15._M_current = __it._M_current + 3;
                    if (bVar3) goto LAB_004916ae;
                    __it._M_current = __it._M_current + 4;
                    lVar13 = lVar13 + -0x80;
                    lVar7 = local_78 + -1;
                  }
                  lVar13 = lVar13 >> 5;
                  if (lVar13 == 1) {
LAB_00491695:
                    bVar3 = __gnu_cxx::__ops::
                            _Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                            ::operator()((_Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                          *)&local_c0,__it);
                    _Var15._M_current = local_90;
                    if (bVar3) {
                      _Var15._M_current = __it._M_current;
                    }
                  }
                  else if (lVar13 == 2) {
LAB_0049160e:
                    bVar3 = __gnu_cxx::__ops::
                            _Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                            ::operator()((_Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                          *)&local_c0,__it);
                    _Var15._M_current = __it._M_current;
                    if (!bVar3) {
                      __it._M_current = __it._M_current + 1;
                      goto LAB_00491695;
                    }
                  }
                  else {
                    _Var15._M_current = local_90;
                    if ((lVar13 == 3) &&
                       (bVar3 = __gnu_cxx::__ops::
                                _Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                                ::operator()((_Iter_pred<cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                              *)&local_c0,__it), _Var15._M_current = __it._M_current
                       , !bVar3)) {
                      __it._M_current = __it._M_current + 1;
                      goto LAB_0049160e;
                    }
                  }
LAB_004916ae:
                  pbVar11 = macros.Values.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (_Var15._M_current ==
                      macros.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::_M_assign(local_70);
                  }
                  else {
                    local_50._M_dataplus._M_p._0_1_ = 0x2e;
                    cmStrCat<char_const(&)[54],std::__cxx11::string&,char>
                              (&local_c0,
                               (char (*) [54])
                               "command specified for \"VALIDATOR\" is not a function: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((args.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + local_a0),(char *)&local_50);
                    cmFindCommon::SetError(this_00,&local_c0);
                    std::__cxx11::string::~string((string *)&local_c0);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&macros.Values);
                  std::_Function_base::~_Function_base(&command.super__Function_base);
                  this_04 = local_98;
                  if (_Var15._M_current != pbVar11) goto LAB_004911ec;
                }
                else {
                  bVar3 = cmFindCommon::CheckCommonArgument
                                    (this_00,args.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar12);
                  if (bVar3) goto LAB_0049135b;
                  switch(uVar10) {
                  case 1:
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(local_80,args.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar12);
                    uVar10 = 1;
                    break;
                  case 2:
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(local_88,args.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar12);
                    uVar10 = 2;
                    break;
                  case 3:
                    cmFindCommon::AddPathSuffix
                              (this_00,args.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar12);
                    uVar10 = 3;
                    break;
                  case 4:
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&this_00->UserHintsArgs,
                                args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar12);
                    uVar10 = 4;
                  }
                }
              }
            }
          }
          uVar12 = (ulong)(uVar9 + 1);
        }
        if ((this_04->VariableDocumentation)._M_string_length == 0) {
          std::__cxx11::string::assign((char *)psVar1);
          __rhs = (this_04->Names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (this_04->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs == pbVar2) {
            std::__cxx11::string::append((char *)psVar1);
          }
          else {
            if ((long)pbVar2 - (long)__rhs == 0x20) {
              std::operator+(&local_c0,"the ",__rhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &command,&local_c0," library be found");
              std::__cxx11::string::append((string *)psVar1);
            }
            else {
              std::__cxx11::string::append((char *)psVar1);
              local_c0._M_dataplus._M_p =
                   (pointer)(this_04->Names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              local_c0._M_string_length =
                   (size_type)
                   ((this_04->Names).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1);
              separator._M_str = ", ";
              separator._M_len = 2;
              cmJoin((string *)&command,(cmStringRange *)&local_c0,separator,(string_view)ZEXT816(0)
                    );
              std::__cxx11::string::append((string *)psVar1);
              std::__cxx11::string::~string((string *)&command);
              std::operator+(&local_c0," or ",
                             (this_04->Names).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &command,&local_c0," libraries be found");
              std::__cxx11::string::append((string *)psVar1);
            }
            std::__cxx11::string::~string((string *)&command);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
        this_02 = local_80;
        if ((!bVar4) &&
           ((this_04->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_04->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&command,local_80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(this_02);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_02,(value_type *)command.super__Function_base._M_functor._M_unused._0_8_)
          ;
          ::cm::
          append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                    (local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (command.super__Function_base._M_functor._M_unused._M_member_pointer +
                              0x20),
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )command.super__Function_base._M_functor._8_8_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&command);
        }
        ExpandPaths(this_04);
        bVar4 = true;
        cmFindCommon::ComputeFinalPaths(this_00,Yes);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
  }
  return bVar4;
}

Assistant:

bool cmFindBase::ParseArguments(std::vector<std::string> const& argsIn)
{
  if (argsIn.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // copy argsIn into args so it can be modified,
  // in the process extract the DOC "documentation"
  // and handle options NO_CACHE and ENV
  size_t size = argsIn.size();
  std::vector<std::string> args;
  bool foundDoc = false;
  for (unsigned int j = 0; j < size; ++j) {
    if (foundDoc || argsIn[j] != "DOC") {
      if (argsIn[j] == "NO_CACHE") {
        this->StoreResultInCache = false;
      } else if (argsIn[j] == "ENV") {
        if (j + 1 < size) {
          j++;
          cmSystemTools::GetPath(args, argsIn[j].c_str());
        }
      } else {
        args.push_back(argsIn[j]);
      }
    } else {
      if (j + 1 < size) {
        foundDoc = true;
        this->VariableDocumentation = argsIn[j + 1];
        j++;
        if (j >= size) {
          break;
        }
      }
    }
  }
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->VariableName = args[0];
  if (this->CheckForVariableDefined()) {
    this->AlreadyDefined = true;
    return true;
  }

  // Find what search path locations have been enabled/disable
  this->SelectDefaultSearchModes();

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  bool newStyle = false;
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingPaths,
    DoingPathSuffixes,
    DoingHints
  };
  Doing doing = DoingNames; // assume it starts with a name
  for (unsigned int j = 1; j < args.size(); ++j) {
    if (args[j] == "NAMES") {
      doing = DoingNames;
      newStyle = true;
    } else if (args[j] == "PATHS") {
      doing = DoingPaths;
      newStyle = true;
    } else if (args[j] == "HINTS") {
      doing = DoingHints;
      newStyle = true;
    } else if (args[j] == "PATH_SUFFIXES") {
      doing = DoingPathSuffixes;
      newStyle = true;
    } else if (args[j] == "NAMES_PER_DIR") {
      doing = DoingNone;
      if (this->NamesPerDirAllowed) {
        this->NamesPerDir = true;
      } else {
        this->SetError("does not support NAMES_PER_DIR");
        return false;
      }
    } else if (args[j] == "NO_SYSTEM_PATH") {
      doing = DoingNone;
      this->NoDefaultPath = true;
    } else if (args[j] == "REQUIRED") {
      doing = DoingNone;
      this->Required = true;
      newStyle = true;
    } else if (args[j] == "REGISTRY_VIEW") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"REGISTRY_VIEW\"");
        return false;
      }
      auto view = cmWindowsRegistry::ToView(args[j]);
      if (view) {
        this->RegistryView = *view;
      } else {
        this->SetError(
          cmStrCat("given invalid value for \"REGISTRY_VIEW\": ", args[j]));
        return false;
      }
    } else if (args[j] == "VALIDATOR") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"VALIDATOR\"");
        return false;
      }
      auto command = this->Makefile->GetState()->GetCommand(args[j]);
      if (command == nullptr) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is undefined: ", args[j], '.'));
        return false;
      }
      // ensure a macro is not specified as validator
      const auto& validatorName = args[j];
      cmList macros{ this->Makefile->GetProperty("MACROS") };
      if (std::find_if(macros.begin(), macros.end(),
                       [&validatorName](const std::string& item) {
                         return cmSystemTools::Strucmp(validatorName.c_str(),
                                                       item.c_str()) == 0;
                       }) != macros.end()) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is not a function: ", args[j],
          '.'));
        return false;
      }
      this->ValidatorName = args[j];
    } else if (this->CheckCommonArgument(args[j])) {
      doing = DoingNone;
    } else {
      // Some common arguments were accidentally supported by CMake
      // 2.4 and 2.6.0 in the short-hand form of the command, so we
      // must support it even though it is not documented.
      if (doing == DoingNames) {
        this->Names.push_back(args[j]);
      } else if (doing == DoingPaths) {
        this->UserGuessArgs.push_back(args[j]);
      } else if (doing == DoingHints) {
        this->UserHintsArgs.push_back(args[j]);
      } else if (doing == DoingPathSuffixes) {
        this->AddPathSuffix(args[j]);
      }
    }
  }

  if (this->VariableDocumentation.empty()) {
    this->VariableDocumentation = "Where can ";
    if (this->Names.empty()) {
      this->VariableDocumentation += "the (unknown) library be found";
    } else if (this->Names.size() == 1) {
      this->VariableDocumentation +=
        "the " + this->Names.front() + " library be found";
    } else {
      this->VariableDocumentation += "one of the ";
      this->VariableDocumentation +=
        cmJoin(cmMakeRange(this->Names).retreat(1), ", ");
      this->VariableDocumentation +=
        " or " + this->Names.back() + " libraries be found";
    }
  }

  // look for old style
  // FIND_*(VAR name path1 path2 ...)
  if (!newStyle && !this->Names.empty()) {
    // All the short-hand arguments have been recorded as names.
    std::vector<std::string> shortArgs = this->Names;
    this->Names.clear(); // clear out any values in Names
    this->Names.push_back(shortArgs[0]);
    cm::append(this->UserGuessArgs, shortArgs.begin() + 1, shortArgs.end());
  }
  this->ExpandPaths();

  this->ComputeFinalPaths(IgnorePaths::Yes);

  return true;
}